

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<int,float>(Thread *this,UnopFunc<int,_float> *f)

{
  Simd<float,_(unsigned_char)__x04_> val;
  SR result;
  float local_38 [4];
  anon_union_16_6_113bff37_for_Value_0 local_28;
  
  local_38 = (float  [4])Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  std::transform<float*,int*,int(*)(float)>
            (local_38,(float *)&local_28.f32_,(int *)&local_28.i32_,f);
  Push(this,(Value)local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}